

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O1

void __thiscall Version_versionMatch_Test::TestBody(Version_versionMatch_Test *this)

{
  char cVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult gtest_ar_1;
  string versionString;
  uint version;
  long *local_50;
  undefined1 local_48 [16];
  AssertHelper local_38 [8];
  undefined1 local_30 [16];
  long local_20 [2];
  uint local_c;
  
  local_c = libcellml::version();
  local_48._0_4_ = 0x603;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((AssertionResult *)local_30,(internal *)"0x000603U","version",local_48,&local_c,
             (uint *)in_R9);
  if (local_30[0] == false) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)local_30._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_30._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/version/version.cpp"
               ,8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((long *)local_48._0_8_ != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_48._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
      local_48._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_30 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::versionString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((AssertionResult *)local_48,(internal *)"\"0.6.3\"","versionString","0.6.3",
             (char (*) [6])local_30,in_R9);
  if (local_48[0] == (Message)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_48._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/version/version.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=(local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_38);
    if (local_50 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_50 != (long *)0x0)) {
        (**(code **)(*local_50 + 8))();
      }
      local_50 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_48 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long *)CONCAT71(local_30._1_7_,local_30[0]) != local_20) {
    operator_delete((long *)CONCAT71(local_30._1_7_,local_30[0]),local_20[0] + 1);
  }
  return;
}

Assistant:

TEST(Version, versionMatch)
{
    unsigned int version = libcellml::version();
    EXPECT_EQ(0x000603U, version);

    std::string versionString = libcellml::versionString();
    EXPECT_EQ("0.6.3", versionString);
}